

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O2

void ximu::PacketConstruction::
     constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (DateTimeData *data,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  uchar uVar1;
  size_t sVar2;
  size_t sVar3;
  initializer_list<unsigned_char> __l;
  uchar local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  undefined1 local_59;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  allocator_type local_31;
  
  local_60 = '\x05';
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dest.container;
  sVar2 = DateTimeData::year(data);
  sVar3 = DateTimeData::year(data);
  local_5f = (byte)((sVar3 - 2000) % 10) | (char)((ushort)((sVar2 - 2000) % 100) / 10) << 4;
  sVar2 = DateTimeData::month(data);
  sVar3 = DateTimeData::month(data);
  local_5e = (byte)(sVar3 % 10) | (char)((ushort)(sVar2 % 100) / 10) << 4;
  sVar2 = DateTimeData::day(data);
  sVar3 = DateTimeData::day(data);
  local_5d = (byte)(sVar3 % 10) | (char)((ushort)(sVar2 % 100) / 10) << 4;
  sVar2 = DateTimeData::hours(data);
  sVar3 = DateTimeData::hours(data);
  local_5c = (byte)(sVar3 % 10) | (char)((ushort)(sVar2 % 100) / 10) << 4;
  sVar2 = DateTimeData::minutes(data);
  sVar3 = DateTimeData::minutes(data);
  local_5b = (byte)(sVar3 % 10) | (char)((ushort)(sVar2 % 100) / 10) << 4;
  sVar2 = DateTimeData::seconds(data);
  sVar3 = DateTimeData::seconds(data);
  local_5a = (byte)(sVar3 % 10) | (char)((ushort)(sVar2 % 100) / 10) << 4;
  local_59 = 0;
  __l._M_len = 8;
  __l._M_array = &local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,__l,&local_31);
  uVar1 = checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_58,
                     (size_t)(decoded.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + ~(ulong)local_58));
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[-1] = uVar1;
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_58,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  return;
}

Assistant:

static void constructWriteDateTimePacket(const DateTimeData& data,
                                         OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::WRITE_DATETIME),
    static_cast<unsigned char>((((((data.year() - 2000) % 100) / 10) << 4)
      | (data.year() - 2000) % 10)),
    static_cast<unsigned char>(((((data.month() % 100) / 10) << 4)
      | (data.month() % 10))),
    static_cast<unsigned char>(((((data.day() % 100) / 10) << 4)	
      | (data.day() % 10))),
    static_cast<unsigned char>(((((data.hours() % 100) / 10) << 4)
      | (data.hours() % 10))),
    static_cast<unsigned char>(((((data.minutes() % 100) / 10) << 4)
      | (data.minutes() % 10))),
     static_cast<unsigned char>(((((data.seconds() % 100) / 10) << 4)
      | (data.seconds() % 10))),
      0
  };
  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}